

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

bool __thiscall
testing::internal::
TypedExpectation<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>)>
::Matches(TypedExpectation<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>)>
          *this,ArgumentTuple *args)

{
  MatcherInterface<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>
  *pMVar1;
  MatcherInterface<const_std::tuple<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>_&>
  *pMVar2;
  undefined1 uVar3;
  int iVar4;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  pMVar1 = (this->matchers_).
           super__Tuple_impl<0UL,_testing::Matcher<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>_>
           .
           super__Head_base<0UL,_testing::Matcher<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>,_false>
           ._M_head_impl.
           super_MatcherBase<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>
           .impl_.value_;
  iVar4 = (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                    (pMVar1,(args->
                            super__Tuple_impl<0UL,_mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>
                            ).
                            super__Head_base<0UL,_mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>,_false>
                            ._M_head_impl.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.
                            super_ExprBase.impl_);
  if ((char)iVar4 == '\0') {
    uVar3 = 0;
  }
  else {
    pMVar2 = (this->extra_matcher_).
             super_MatcherBase<const_std::tuple<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>_&>
             .impl_.value_;
    iVar4 = (*(pMVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (pMVar2,args);
    uVar3 = (undefined1)iVar4;
  }
  return (bool)uVar3;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }